

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O3

bool32 rw::ps2::rasterFromImage(Raster *raster,Image *image)

{
  byte bVar1;
  uint8 *puVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uint dststride;
  int iVar7;
  long lVar8;
  uint8 *in;
  uint8 *puVar9;
  bool bVar10;
  
  iVar6 = image->depth;
  uVar3 = iVar6 << 0x1e | iVar6 - 4U >> 2;
  if (uVar3 < 8) {
    lVar8 = (long)nativeRasterOffset;
    switch(uVar3) {
    case 0:
      if (raster->format == 0x4500) {
        bVar10 = true;
        iVar5 = 0x10;
LAB_0012b8e8:
        if (iVar6 < 9) {
          puVar9 = image->palette;
          puVar2 = Raster::lockPalette(raster,5);
          memcpy(puVar2,puVar9,(ulong)(uint)(iVar5 * 4));
          if (bVar10) {
            lVar4 = 0;
            do {
              puVar2[lVar4 * 4 + 3] = (uint8)((uint)puVar2[lVar4 * 4 + 3] * 0x404080 >> 0x17);
              lVar4 = lVar4 + 1;
            } while (iVar5 + (uint)(iVar5 == 0) != (int)lVar4);
          }
          Raster::unlockPalette(raster);
          bVar10 = image->depth == 4;
        }
        else {
          bVar10 = false;
        }
        bVar1 = *(byte *)((long)&raster->pixels + lVar8 + 4);
        uVar3 = 0x20;
        if ((bVar1 & 4) == 0) {
          uVar3 = 8;
        }
        if (!bVar10) {
          uVar3 = 8;
        }
        dststride = 0x10;
        if ((bVar1 & 2) == 0) {
          dststride = uVar3;
        }
        if (bVar10) {
          dststride = uVar3;
        }
        if ((int)dststride < image->width) {
          dststride = image->width;
        }
        puVar9 = image->pixels;
        puVar2 = Raster::lock(raster,0,5);
        if (image->depth == 4) {
          compressPal4(puVar2,dststride >> 1,puVar9,image->stride,image->width,image->height);
        }
        else if (image->depth == 8) {
          copyPal8(puVar2,dststride,puVar9,image->stride,image->width,image->height);
        }
        else {
          iVar6 = image->height;
          if (0 < iVar6) {
            iVar5 = image->width;
            iVar7 = 0;
            do {
              if (0 < iVar5) {
                iVar6 = 0;
                in = puVar9;
                do {
                  iVar5 = image->depth;
                  if (iVar5 == 0x20) {
                    *puVar2 = *in;
                    puVar2[1] = in[1];
                    puVar2[2] = in[2];
                    puVar2[3] = (uint8)((uint)in[3] * 0x404080 >> 0x17);
LAB_0012ba83:
                    puVar2 = puVar2 + 4;
                  }
                  else {
                    if (iVar5 == 0x18) {
                      *puVar2 = *in;
                      puVar2[1] = in[1];
                      puVar2[2] = in[2];
                      puVar2[3] = 0x80;
                      goto LAB_0012ba83;
                    }
                    if (iVar5 == 0x10) {
                      conv_ABGR1555_from_ARGB1555(puVar2,in);
                      puVar2 = puVar2 + 2;
                    }
                  }
                  in = in + image->bpp;
                  iVar6 = iVar6 + 1;
                  iVar5 = image->width;
                } while (iVar6 < iVar5);
                iVar6 = image->height;
              }
              puVar9 = puVar9 + image->stride;
              iVar7 = iVar7 + 1;
            } while (iVar7 < iVar6);
          }
        }
        Raster::unlock(raster,0);
        return 1;
      }
      break;
    case 1:
      if (raster->format == 0x2500) {
        bVar10 = true;
        iVar5 = 0x100;
        goto LAB_0012b8e8;
      }
      break;
    case 3:
      iVar5 = 0;
      bVar10 = false;
      if (raster->format == 0x100) goto LAB_0012b8e8;
      break;
    case 5:
    case 7:
      uVar3 = raster->format;
      if ((uVar3 == 0x500) || (uVar3 == 0x600)) {
        iVar5 = 0;
        bVar10 = false;
        if ((uVar3 & 0xf00) == 0x600) {
          rasterFromImage();
          return 0;
        }
        goto LAB_0012b8e8;
      }
    }
  }
  rasterFromImage();
  return 0;
}

Assistant:

bool32
rasterFromImage(Raster *raster, Image *image)
{
	Ps2Raster *natras = GETPS2RASTEREXT(raster);

	int32 pallength = 0;
	switch(image->depth){
	case 24:
	case 32:
		if(raster->format != Raster::C8888 &&
		   raster->format != Raster::C888)	// unsafe already
			goto err;
		break;
	case 16:
		if(raster->format != Raster::C1555) goto err;
		break;
	case 8:
		if(raster->format != (Raster::PAL8 | Raster::C8888)) goto err;
		pallength = 256;
		break;
	case 4:
		if(raster->format != (Raster::PAL4 | Raster::C8888)) goto err;
		pallength = 16;
		break;
	default:
	err:
		RWERROR((ERR_INVRASTER));
		return 0;
	}

	// unsafe
	if((raster->format&0xF00) == Raster::C888){
		RWERROR((ERR_INVRASTER));
		return 0;
	}

	uint8 *in, *out;
	if(image->depth <= 8){
		in = image->palette;
		out = raster->lockPalette(Raster::LOCKWRITE|Raster::LOCKNOFETCH);
		memcpy(out, in, 4*pallength);
		for(int32 i = 0; i < pallength; i++){
			out[3] = out[3]*128/255;
			out += 4;
		}
		raster->unlockPalette();
	}

	int minw, minh;
	int tw;
	transferMinSize(image->depth == 4 ? PSMT4 : PSMT8, natras->flags, &minw, &minh);
	tw = max(image->width, minw);
	uint8 *src = image->pixels;
	out = raster->lock(0, Raster::LOCKWRITE|Raster::LOCKNOFETCH);
	if(image->depth == 4){
		compressPal4(out, tw/2, src, image->stride, image->width, image->height);
	}else if(image->depth == 8){
		copyPal8(out, tw, src, image->stride, image->width, image->height);
	}else{
		for(int32 y = 0; y < image->height; y++){
			in = src;
			for(int32 x = 0; x < image->width; x++){
				switch(image->depth){
				case 16:
					conv_ARGB1555_from_ABGR1555(out, in);
					out += 2;
					break;
				case 24:
					out[0] = in[0];
					out[1] = in[1];
					out[2] = in[2];
					out[3] = 0x80;
					out += 4;
					break;
				case 32:
					out[0] = in[0];
					out[1] = in[1];
					out[2] = in[2];
					out[3] = in[3]*128/255;
					out += 4;
					break;
				}
				in += image->bpp;
			}
			src += image->stride;
		}
	}
	raster->unlock(0);
	return 1;
}